

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

bool __thiscall Tokenizer::tryToSkipSpaces(Tokenizer *this)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  
  bVar3 = false;
  while( true ) {
    cVar1 = Stream::peek(&this->stream_);
    iVar2 = isspace((int)cVar1);
    if (iVar2 == 0) break;
    Stream::advance(&this->stream_);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool Tokenizer::tryToSkipSpaces()
{
  bool result = false;
  while(isspace(stream_.peek()))
  {
    result = true;
    stream_.advance();
  }

  return result;
}